

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O0

cf_void_t cf_hashtbl_set(cf_hashtbl_t *self,cf_void_t *key,cf_size_t len,cf_void_t *value)

{
  hashtbl_node_t *phVar1;
  hashtbl_node_t *node;
  cf_void_t *value_local;
  cf_size_t len_local;
  cf_void_t *key_local;
  cf_hashtbl_t *self_local;
  
  if (value == (cf_void_t *)0x0) {
    hashtbl_remove_node(self,key,len);
  }
  else {
    phVar1 = hashtbl_get_node(self,key,len,1);
    if (phVar1 != (hashtbl_node_t *)0x0) {
      phVar1->value = value;
    }
  }
  return;
}

Assistant:

cf_void_t cf_hashtbl_set(cf_hashtbl_t* self, const cf_void_t* key, cf_size_t len, cf_void_t* value) {
    hashtbl_node_t* node = CF_NULL_PTR;

    /* clear item */
    if (value == CF_NULL_PTR) {
        hashtbl_remove_node(self, key, len);
        return;
    }

    node = hashtbl_get_node(self, key, len, CF_TRUE);
    if (node) {
        node->value = value;
    }
}